

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  ulong byte_size_before_serialization;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint8 *end;
  uint8 *start;
  LogMessage local_68;
  ulong local_30;
  size_t byte_size;
  size_t old_size;
  string *output_local;
  MessageLite *this_local;
  
  old_size = (size_t)output;
  output_local = (string *)this;
  byte_size = std::__cxx11::string::size();
  iVar1 = (*this->_vptr_MessageLite[0xc])();
  local_30 = CONCAT44(extraout_var,iVar1);
  if (local_30 < 0x80000000) {
    STLStringResizeUninitialized((string *)old_size,byte_size + local_30);
    pcVar4 = io::mutable_string_data((string *)old_size);
    pcVar4 = pcVar4 + byte_size;
    iVar1 = (*this->_vptr_MessageLite[0xe])(this,pcVar4);
    byte_size_before_serialization = local_30;
    if (CONCAT44(extraout_var_00,iVar1) - (long)pcVar4 != local_30) {
      iVar2 = (*this->_vptr_MessageLite[0xc])();
      anon_unknown_12::ByteSizeConsistencyError
                (byte_size_before_serialization,CONCAT44(extraout_var_01,iVar2),
                 CONCAT44(extraout_var_00,iVar1) - (long)pcVar4,this);
    }
    this_local._7_1_ = true;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x12e);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"Exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_30);
    internal::LogFinisher::operator=((LogFinisher *)((long)&start + 3),pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::AppendPartialToString(string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSizeLong(), end - start, *this);
  }
  return true;
}